

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O0

int * configuracaoInicial(char *arqIn)

{
  int iVar1;
  int local_24;
  int i;
  int *ids;
  char *arqIn_local;
  
  iVar1 = strcmp(arqIn,"networks/sis33.m");
  if (iVar1 == 0) {
    arqIn_local = (char *)operator_new__(0x14);
    arqIn_local[0] = '!';
    arqIn_local[1] = '\0';
    arqIn_local[2] = '\0';
    arqIn_local[3] = '\0';
    arqIn_local[4] = '\"';
    arqIn_local[5] = '\0';
    arqIn_local[6] = '\0';
    arqIn_local[7] = '\0';
    arqIn_local[8] = '#';
    arqIn_local[9] = '\0';
    arqIn_local[10] = '\0';
    arqIn_local[0xb] = '\0';
    arqIn_local[0xc] = '$';
    arqIn_local[0xd] = '\0';
    arqIn_local[0xe] = '\0';
    arqIn_local[0xf] = '\0';
    arqIn_local[0x10] = '%';
    arqIn_local[0x11] = '\0';
    arqIn_local[0x12] = '\0';
    arqIn_local[0x13] = '\0';
  }
  else {
    iVar1 = strcmp(arqIn,"networks/sis33modif.m");
    if (iVar1 == 0) {
      arqIn_local = (char *)operator_new__(0x14);
      arqIn_local[0] = '!';
      arqIn_local[1] = '\0';
      arqIn_local[2] = '\0';
      arqIn_local[3] = '\0';
      arqIn_local[4] = '\"';
      arqIn_local[5] = '\0';
      arqIn_local[6] = '\0';
      arqIn_local[7] = '\0';
      arqIn_local[8] = '#';
      arqIn_local[9] = '\0';
      arqIn_local[10] = '\0';
      arqIn_local[0xb] = '\0';
      arqIn_local[0xc] = '$';
      arqIn_local[0xd] = '\0';
      arqIn_local[0xe] = '\0';
      arqIn_local[0xf] = '\0';
      arqIn_local[0x10] = '%';
      arqIn_local[0x11] = '\0';
      arqIn_local[0x12] = '\0';
      arqIn_local[0x13] = '\0';
    }
    else {
      iVar1 = strcmp(arqIn,"networks/sis119.m");
      if (iVar1 == 0) {
        arqIn_local = (char *)operator_new__(0x3c);
        arqIn_local[0] = 'w';
        arqIn_local[1] = '\0';
        arqIn_local[2] = '\0';
        arqIn_local[3] = '\0';
        arqIn_local[4] = 'x';
        arqIn_local[5] = '\0';
        arqIn_local[6] = '\0';
        arqIn_local[7] = '\0';
        arqIn_local[8] = 'y';
        arqIn_local[9] = '\0';
        arqIn_local[10] = '\0';
        arqIn_local[0xb] = '\0';
        arqIn_local[0xc] = 'z';
        arqIn_local[0xd] = '\0';
        arqIn_local[0xe] = '\0';
        arqIn_local[0xf] = '\0';
        arqIn_local[0x10] = '{';
        arqIn_local[0x11] = '\0';
        arqIn_local[0x12] = '\0';
        arqIn_local[0x13] = '\0';
        arqIn_local[0x14] = '|';
        arqIn_local[0x15] = '\0';
        arqIn_local[0x16] = '\0';
        arqIn_local[0x17] = '\0';
        arqIn_local[0x18] = '}';
        arqIn_local[0x19] = '\0';
        arqIn_local[0x1a] = '\0';
        arqIn_local[0x1b] = '\0';
        arqIn_local[0x1c] = '~';
        arqIn_local[0x1d] = '\0';
        arqIn_local[0x1e] = '\0';
        arqIn_local[0x1f] = '\0';
        arqIn_local[0x20] = '\x7f';
        arqIn_local[0x21] = '\0';
        arqIn_local[0x22] = '\0';
        arqIn_local[0x23] = '\0';
        arqIn_local[0x24] = -0x80;
        arqIn_local[0x25] = '\0';
        arqIn_local[0x26] = '\0';
        arqIn_local[0x27] = '\0';
        arqIn_local[0x28] = -0x7f;
        arqIn_local[0x29] = '\0';
        arqIn_local[0x2a] = '\0';
        arqIn_local[0x2b] = '\0';
        arqIn_local[0x2c] = -0x7e;
        arqIn_local[0x2d] = '\0';
        arqIn_local[0x2e] = '\0';
        arqIn_local[0x2f] = '\0';
        arqIn_local[0x30] = -0x7d;
        arqIn_local[0x31] = '\0';
        arqIn_local[0x32] = '\0';
        arqIn_local[0x33] = '\0';
        arqIn_local[0x34] = -0x7c;
        arqIn_local[0x35] = '\0';
        arqIn_local[0x36] = '\0';
        arqIn_local[0x37] = '\0';
        arqIn_local[0x38] = -0x7b;
        arqIn_local[0x39] = '\0';
        arqIn_local[0x3a] = '\0';
        arqIn_local[0x3b] = '\0';
        for (local_24 = 0; local_24 < 0xf; local_24 = local_24 + 1) {
          *(int *)(arqIn_local + (long)local_24 * 4) =
               *(int *)(arqIn_local + (long)local_24 * 4) + -1;
        }
      }
      else {
        iVar1 = strcmp(arqIn,"networks/sis83.m");
        if (iVar1 == 0) {
          arqIn_local = (char *)operator_new__(0x34);
          arqIn_local[0] = 'T';
          arqIn_local[1] = '\0';
          arqIn_local[2] = '\0';
          arqIn_local[3] = '\0';
          arqIn_local[4] = 'U';
          arqIn_local[5] = '\0';
          arqIn_local[6] = '\0';
          arqIn_local[7] = '\0';
          arqIn_local[8] = 'V';
          arqIn_local[9] = '\0';
          arqIn_local[10] = '\0';
          arqIn_local[0xb] = '\0';
          arqIn_local[0xc] = 'W';
          arqIn_local[0xd] = '\0';
          arqIn_local[0xe] = '\0';
          arqIn_local[0xf] = '\0';
          arqIn_local[0x10] = 'X';
          arqIn_local[0x11] = '\0';
          arqIn_local[0x12] = '\0';
          arqIn_local[0x13] = '\0';
          arqIn_local[0x14] = 'Y';
          arqIn_local[0x15] = '\0';
          arqIn_local[0x16] = '\0';
          arqIn_local[0x17] = '\0';
          arqIn_local[0x18] = 'Z';
          arqIn_local[0x19] = '\0';
          arqIn_local[0x1a] = '\0';
          arqIn_local[0x1b] = '\0';
          arqIn_local[0x1c] = '[';
          arqIn_local[0x1d] = '\0';
          arqIn_local[0x1e] = '\0';
          arqIn_local[0x1f] = '\0';
          arqIn_local[0x20] = '\\';
          arqIn_local[0x21] = '\0';
          arqIn_local[0x22] = '\0';
          arqIn_local[0x23] = '\0';
          arqIn_local[0x24] = ']';
          arqIn_local[0x25] = '\0';
          arqIn_local[0x26] = '\0';
          arqIn_local[0x27] = '\0';
          arqIn_local[0x28] = '^';
          arqIn_local[0x29] = '\0';
          arqIn_local[0x2a] = '\0';
          arqIn_local[0x2b] = '\0';
          arqIn_local[0x2c] = '_';
          arqIn_local[0x2d] = '\0';
          arqIn_local[0x2e] = '\0';
          arqIn_local[0x2f] = '\0';
          arqIn_local[0x30] = '`';
          arqIn_local[0x31] = '\0';
          arqIn_local[0x32] = '\0';
          arqIn_local[0x33] = '\0';
        }
        else {
          iVar1 = strcmp(arqIn,"networks/sis83modif.m");
          if (iVar1 == 0) {
            arqIn_local = (char *)operator_new__(0x34);
            arqIn_local[0] = 'T';
            arqIn_local[1] = '\0';
            arqIn_local[2] = '\0';
            arqIn_local[3] = '\0';
            arqIn_local[4] = 'U';
            arqIn_local[5] = '\0';
            arqIn_local[6] = '\0';
            arqIn_local[7] = '\0';
            arqIn_local[8] = 'V';
            arqIn_local[9] = '\0';
            arqIn_local[10] = '\0';
            arqIn_local[0xb] = '\0';
            arqIn_local[0xc] = 'W';
            arqIn_local[0xd] = '\0';
            arqIn_local[0xe] = '\0';
            arqIn_local[0xf] = '\0';
            arqIn_local[0x10] = 'X';
            arqIn_local[0x11] = '\0';
            arqIn_local[0x12] = '\0';
            arqIn_local[0x13] = '\0';
            arqIn_local[0x14] = 'Y';
            arqIn_local[0x15] = '\0';
            arqIn_local[0x16] = '\0';
            arqIn_local[0x17] = '\0';
            arqIn_local[0x18] = 'Z';
            arqIn_local[0x19] = '\0';
            arqIn_local[0x1a] = '\0';
            arqIn_local[0x1b] = '\0';
            arqIn_local[0x1c] = '[';
            arqIn_local[0x1d] = '\0';
            arqIn_local[0x1e] = '\0';
            arqIn_local[0x1f] = '\0';
            arqIn_local[0x20] = '\\';
            arqIn_local[0x21] = '\0';
            arqIn_local[0x22] = '\0';
            arqIn_local[0x23] = '\0';
            arqIn_local[0x24] = ']';
            arqIn_local[0x25] = '\0';
            arqIn_local[0x26] = '\0';
            arqIn_local[0x27] = '\0';
            arqIn_local[0x28] = '^';
            arqIn_local[0x29] = '\0';
            arqIn_local[0x2a] = '\0';
            arqIn_local[0x2b] = '\0';
            arqIn_local[0x2c] = '_';
            arqIn_local[0x2d] = '\0';
            arqIn_local[0x2e] = '\0';
            arqIn_local[0x2f] = '\0';
            arqIn_local[0x30] = '`';
            arqIn_local[0x31] = '\0';
            arqIn_local[0x32] = '\0';
            arqIn_local[0x33] = '\0';
          }
          else {
            arqIn_local = (char *)operator_new__(4);
            arqIn_local[0] = '\0';
            arqIn_local[1] = '\0';
            arqIn_local[2] = '\0';
            arqIn_local[3] = '\0';
          }
        }
      }
    }
  }
  return (int *)arqIn_local;
}

Assistant:

int *configuracaoInicial(char *arqIn) {
    int *ids;
    if (strcmp(arqIn, "networks/sis33.m") == 0) {

        ids = new int[5];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 9;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }

        return ids;
    }

    if (strcmp(arqIn, "networks/sis33modif.m") == 0) {

        ids = new int[5];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 28;
            ids[4] = 36;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 16;
            ids[4] = 28;
        }

        return ids;
    }

    if (strcmp(arqIn, "networks/sis119.m") == 0) {

        ids = new int[15];
        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 119;
            ids[1] = 120;
            ids[2] = 121;
            ids[3] = 122;
            ids[4] = 123;
            ids[5] = 124;
            ids[6] = 125;
            ids[7] = 126;
            ids[8] = 127;
            ids[9] = 128;
            ids[10] = 129;
            ids[11] = 130;
            ids[12] = 131;
            ids[13] = 132;
            ids[14] = 133;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 24;
            ids[1] = 27;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 52;
            ids[6] = 59;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 99;
            ids[11] = 110;
            ids[12] = 123;
            ids[13] = 130;
            ids[14] = 131;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 24;
            ids[1] = 26;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 51;
            ids[6] = 61;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 98;
            ids[11] = 110;
            ids[12] = 122;
            ids[13] = 130;
            ids[14] = 131;
        }

        /*
        esse arquivo tem na verdade 132 arcos ao inves de 133
        dessa forma os ids dos arcos abertos deve ser subtraido 1.
        */
        for (int i = 0; i < 15; i++)
            ids[i]--;

        return ids;
    }
    if (strcmp(arqIn, "networks/sis83.m") == 0) {

        ids = new int[13];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 55;
            ids[6] = 62;
            ids[7] = 72;
            ids[8] = 83;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }

        return ids;
    }
    if (strcmp(arqIn, "networks/sis83modif.m") == 0) {

        ids = new int[13];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 33;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (strcmp(configuracao, "literatura2") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }

        return ids;
    }

    ids = new int[1];
    ids[0] = 0;
    return ids;
}